

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O0

int SHA384_512ResultN(SHA512Context *context,uint8_t *Message_Digest,int HashSize)

{
  int local_28;
  int i;
  int HashSize_local;
  uint8_t *Message_Digest_local;
  SHA512Context *context_local;
  
  if ((context == (SHA512Context *)0x0) || (Message_Digest == (uint8_t *)0x0)) {
    context_local._4_4_ = 1;
  }
  else if (context->Corrupted == 0) {
    if (context->Computed == 0) {
      SHA384_512Finalize(context,0x80);
    }
    for (local_28 = 0; local_28 < HashSize; local_28 = local_28 + 1) {
      Message_Digest[local_28] =
           (uint8_t)(context->Intermediate_Hash[local_28 >> 3] >>
                    (('\a' - (char)(local_28 % 8)) * '\b' & 0x3fU));
    }
    context_local._4_4_ = 0;
  }
  else {
    context_local._4_4_ = context->Corrupted;
  }
  return context_local._4_4_;
}

Assistant:

static int SHA384_512ResultN(SHA512Context *context,
    uint8_t Message_Digest[], int HashSize)
{
    int i;

#ifdef USE_32BIT_ONLY
    int i2;
#endif /* USE_32BIT_ONLY */

    if (!context || !Message_Digest)
        return shaNull;

    if (context->Corrupted)
        return context->Corrupted;

    if (!context->Computed)
        SHA384_512Finalize(context, 0x80);

#ifdef USE_32BIT_ONLY
    for (i = i2 = 0; i < HashSize;) {
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 24);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 16);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 8);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2++]);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 24);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 16);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2] >> 8);
        Message_Digest[i++] = (uint8_t)(context->Intermediate_Hash[i2++]);
    }
#else /* !USE_32BIT_ONLY */
    for (i = 0; i < HashSize; ++i)
        Message_Digest[i] = (uint8_t)
        (context->Intermediate_Hash[i >> 3] >> 8 * (7 - (i % 8)));
#endif /* USE_32BIT_ONLY */

    return shaSuccess;
}